

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DbCheckPostLower.cpp
# Opt level: O1

void __thiscall DbCheckPostLower::Check(DbCheckPostLower *this,Opnd *opnd)

{
  IRType IVar1;
  code *pcVar2;
  OpndKind OVar3;
  OpndKind OVar4;
  bool bVar5;
  undefined4 *puVar6;
  SymOpnd *pSVar7;
  StackSym *pSVar8;
  uint uVar9;
  long lVar10;
  
  if (opnd == (Opnd *)0x0) {
    return;
  }
  OVar3 = IR::Opnd::GetKind(opnd);
  OVar4 = IR::Opnd::GetKind(opnd);
  if (OVar3 == OpndKindReg) {
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_0040859a;
      *puVar6 = 0;
    }
  }
  else {
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar4 != OpndKindIndir) {
      OVar4 = IR::Opnd::GetKind(opnd);
      if (OVar3 == OpndKindList) {
        if (OVar4 != OpndKindList) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1a4,"(this->IsListOpnd())","Bad call to AsListOpnd()");
          if (!bVar5) goto LAB_0040859a;
          *puVar6 = 0;
        }
        if (*(int *)&opnd[1]._vptr_Opnd < 1) {
          return;
        }
        lVar10 = 0;
        do {
          Check(this,*(Opnd **)(*(long *)&opnd[1].m_valueType + lVar10 * 8));
          lVar10 = lVar10 + 1;
        } while (lVar10 < *(int *)&opnd[1]._vptr_Opnd);
        return;
      }
      if (OVar4 != OpndKindSym) {
        return;
      }
      OVar3 = IR::Opnd::GetKind(opnd);
      if (OVar3 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar6 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_0040859a;
        *puVar6 = 0;
      }
      if (*(char *)((long)opnd[1]._vptr_Opnd + 0x14) != '\x01') {
        return;
      }
      if ((this->func->field_0x242 & 0x40) != 0) {
        pSVar7 = IR::Opnd::AsSymOpnd(opnd);
        pSVar8 = Sym::AsStackSym(pSVar7->m_sym);
        if ((pSVar8->field_0x19 & 0x10) == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar6 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                             ,0xe9,"(opnd->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated())",
                             "No Stack space allocated for StackSym?");
          if (!bVar5) goto LAB_0040859a;
          *puVar6 = 0;
        }
      }
      pSVar7 = IR::Opnd::AsSymOpnd(opnd);
      pSVar8 = Sym::AsStackSym(pSVar7->m_sym);
      if ((ulong)pSVar8->m_type == 0x19) {
        return;
      }
      uVar9 = 8;
      if (8 < TySize[pSVar8->m_type]) {
        uVar9 = TySize[pSVar8->m_type];
      }
      pSVar7 = IR::Opnd::AsSymOpnd(opnd);
      IVar1 = (pSVar7->super_Opnd).m_type;
      pSVar7 = IR::Opnd::AsSymOpnd(opnd);
      if (pSVar7->m_offset + TySize[IVar1] <= uVar9) {
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/DbCheckPostLower.cpp"
                         ,0xef,
                         "(static_cast<uint>(TySize[opnd->AsSymOpnd()->GetType()]) + opnd->AsSymOpnd()->m_offset <= symSize)"
                         ,"SymOpnd cannot refer to a size greater than Sym\'s reference");
      if (bVar5) {
        *puVar6 = 0;
        return;
      }
LAB_0040859a:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    if (OVar3 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar5) goto LAB_0040859a;
      *puVar6 = 0;
    }
    Check(this,(RegOpnd *)opnd[1]._vptr_Opnd);
    OVar3 = IR::Opnd::GetKind(opnd);
    if (OVar3 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar5) goto LAB_0040859a;
      *puVar6 = 0;
    }
    opnd = *(Opnd **)&opnd[1].m_valueType;
  }
  Check(this,(RegOpnd *)opnd);
  return;
}

Assistant:

void DbCheckPostLower::Check(IR::Opnd *opnd)
{
    if (opnd == NULL)
    {
        return;
    }

    if (opnd->IsRegOpnd())
    {
        this->Check(opnd->AsRegOpnd());
    }
    else if (opnd->IsIndirOpnd())
    {
        this->Check(opnd->AsIndirOpnd()->GetBaseOpnd());
        this->Check(opnd->AsIndirOpnd()->GetIndexOpnd());
    }
    else if (opnd->IsListOpnd())
    {
        opnd->AsListOpnd()->Map([&](int i, IR::Opnd* opnd) { this->Check(opnd); });
    }
    else if (opnd->IsSymOpnd() && opnd->AsSymOpnd()->m_sym->IsStackSym())
    {
        if (this->func->isPostRegAlloc)
        {
            AssertMsg(opnd->AsSymOpnd()->m_sym->AsStackSym()->IsAllocated(), "No Stack space allocated for StackSym?");
        }
        IRType symType = opnd->AsSymOpnd()->m_sym->AsStackSym()->GetType();
        if (symType != TyMisc)
        {
            uint symSize = static_cast<uint>(max(TySize[symType], MachRegInt));
            AssertMsg(static_cast<uint>(TySize[opnd->AsSymOpnd()->GetType()]) + opnd->AsSymOpnd()->m_offset <= symSize, "SymOpnd cannot refer to a size greater than Sym's reference");
        }
    }
}